

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  long lVar1;
  bool bVar2;
  int iVar3;
  Reflection *this_00;
  UnknownFieldSet *this_01;
  Descriptor *pDVar4;
  MapFieldBase *this_02;
  Message *pMVar5;
  ulong uVar6;
  int index;
  MapIterator iter;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator end;
  MapIterator local_a8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_78;
  MapIterator local_60;
  
  this_00 = GetReflectionOrDie(message);
  this_01 = Reflection::MutableUnknownFields(this_00,message);
  if ((this_01->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_01->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    UnknownFieldSet::ClearFallback(this_01);
  }
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&local_78);
  if (local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      this = local_78.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6];
      if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
        local_a8.iter_ = FieldDescriptor::TypeOnceInit;
        local_60.iter_ = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_a8,
                   (FieldDescriptor **)&local_60);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) == 10) {
        if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
          local_a8.iter_ = FieldDescriptor::TypeOnceInit;
          local_60.iter_ = this;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_a8,
                     (FieldDescriptor **)&local_60);
        }
        if ((*(int *)(this + 0x38) == 0xb) &&
           (bVar2 = FieldDescriptor::is_map_message_type(this), bVar2)) {
          pDVar4 = FieldDescriptor::message_type(this);
          lVar1 = *(long *)(pDVar4 + 0x28);
          if (*(once_flag **)(lVar1 + 200) != (once_flag *)0x0) {
            local_60.iter_ = (void *)(lVar1 + 0x98);
            local_a8.iter_ = FieldDescriptor::TypeOnceInit;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(lVar1 + 200),(_func_void_FieldDescriptor_ptr **)&local_a8,
                       (FieldDescriptor **)&local_60);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0xd0) * 4) ==
              10) {
            this_02 = Reflection::MutableMapData(this_00,message,this);
            bVar2 = MapFieldBase::IsMapValid(this_02);
            if (bVar2) {
              MapIterator::MapIterator(&local_a8,message,this);
              MapIterator::MapIterator(&local_60,message,this);
              (*this_02->_vptr_MapFieldBase[6])(this_02,&local_a8);
              (*this_02->_vptr_MapFieldBase[7])(this_02,&local_60);
              while (iVar3 = (*(local_a8.map_)->_vptr_MapFieldBase[5])
                                       (local_a8.map_,&local_a8,&local_60), (char)iVar3 == '\0') {
                MapFieldBase::SetMapDirty(local_a8.map_);
                pMVar5 = MapValueRef::MutableMessageValue(&local_a8.value_);
                (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
                (*(local_a8.map_)->_vptr_MapFieldBase[0x12])(local_a8.map_,&local_a8);
              }
              MapIterator::~MapIterator(&local_60);
              MapIterator::~MapIterator(&local_a8);
            }
            goto LAB_002a8cea;
          }
        }
        if (*(int *)(this + 0x3c) == 3) {
          iVar3 = Reflection::FieldSize(this_00,message,this);
          if (0 < iVar3) {
            index = 0;
            do {
              pMVar5 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
              (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
              index = index + 1;
            } while (iVar3 != index);
          }
        }
        else {
          pMVar5 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
          (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
        }
      }
LAB_002a8cea:
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_78.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}